

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O1

int Spl_ManComputeOne(Spl_Man_t *p,int iPivot)

{
  uint *puVar1;
  Gia_Man_t *p_00;
  Vec_Wec_t *pVVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Bit_t *pVVar5;
  Vec_Int_t *pVVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  
  if (-1 < iPivot) {
    p_00 = p->pGia;
    pVVar2 = p_00->vMapping2;
    if (iPivot < pVVar2->nSize) {
      if (pVVar2->pArray[(uint)iPivot].nSize == 0) {
        __assert_fail("Gia_ObjIsLut2(p->pGia, iPivot)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                      ,0x1d0,"int Spl_ManComputeOne(Spl_Man_t *, int)");
      }
      pVVar3 = p->vNodes;
      if (0 < pVVar3->nSize) {
        piVar4 = pVVar3->pArray;
        pVVar5 = p->vMarksNo;
        lVar10 = 0;
        do {
          uVar8 = piVar4[lVar10];
          if (((int)uVar8 < 0) || (pVVar5->nSize <= (int)uVar8)) goto LAB_007c266e;
          bVar7 = (byte)uVar8 & 0x1f;
          puVar1 = (uint *)(pVVar5->pArray + (uVar8 >> 5));
          *puVar1 = *puVar1 & (-2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7);
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar3->nSize);
      }
      pVVar6 = p->vAnds;
      if (0 < pVVar6->nSize) {
        piVar4 = pVVar6->pArray;
        pVVar5 = p->vMarksAnd;
        lVar10 = 0;
        do {
          uVar8 = piVar4[lVar10];
          if (((int)uVar8 < 0) || (pVVar5->nSize <= (int)uVar8)) {
LAB_007c266e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
          }
          bVar7 = (byte)uVar8 & 0x1f;
          puVar1 = (uint *)(pVVar5->pArray + (uVar8 >> 5));
          *puVar1 = *puVar1 & (-2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7);
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar6->nSize);
      }
      iVar9 = 0;
      pVVar3->nSize = 0;
      pVVar6->nSize = 0;
      Spl_ManLutMffcSize(p_00,iPivot,p->vCands,p->vMarksAnd);
      Spl_ManAddNode(p,iPivot,p->vCands);
      if (p->vAnds->nSize <= p->Limit) {
        uVar8 = Spl_ManFindOne(p);
        while (uVar8 != 0) {
          if ((int)uVar8 < 0) goto LAB_007c268d;
          pVVar2 = p->pGia->vMapping2;
          if (pVVar2->nSize <= (int)uVar8) goto LAB_007c268d;
          if (pVVar2->pArray[uVar8].nSize == 0) {
            __assert_fail("Gia_ObjIsLut2(p->pGia, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                          ,0x1e8,"int Spl_ManComputeOne(Spl_Man_t *, int)");
          }
          if (p->vMarksNo->nSize <= (int)uVar8) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          if (((uint)p->vMarksNo->pArray[uVar8 >> 5] >> (uVar8 & 0x1f) & 1) != 0) {
            __assert_fail("!Vec_BitEntry(p->vMarksNo, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                          ,0x1e9,"int Spl_ManComputeOne(Spl_Man_t *, int)");
          }
          iVar9 = Spl_ManLutMffcSize(p->pGia,uVar8,p->vCands,p->vMarksAnd);
          if (p->Limit < iVar9 + p->vAnds->nSize) break;
          Spl_ManAddNode(p,uVar8,p->vCands);
          uVar8 = Spl_ManFindOne(p);
        }
        qsort(p->vNodes->pArray,(long)p->vNodes->nSize,4,Vec_IntSortCompare1);
        qsort(p->vAnds->pArray,(long)p->vAnds->nSize,4,Vec_IntSortCompare1);
        Spl_ManWinFindLeavesRoots(p);
        qsort(p->vLeaves->pArray,(long)p->vLeaves->nSize,4,Vec_IntSortCompare1);
        qsort(p->vRoots->pArray,(long)p->vRoots->nSize,4,Vec_IntSortCompare1);
        iVar9 = 1;
      }
      return iVar9;
    }
  }
LAB_007c268d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

int Spl_ManComputeOne( Spl_Man_t * p, int iPivot )
{
    int CountAdd, iObj, i;
    assert( Gia_ObjIsLut2(p->pGia, iPivot) );
//Gia_ManPrintCone2( p->pGia, Gia_ManObj(p->pGia, iPivot) );
    // assume it was previously filled in
    Vec_IntForEachEntry( p->vNodes, iObj, i )
        Vec_BitWriteEntry( p->vMarksNo, iObj, 0 );
    Vec_IntForEachEntry( p->vAnds, iObj, i )
        Vec_BitWriteEntry( p->vMarksAnd, iObj, 0 );
    // double check that it is empty
    //Gia_ManForEachLut2( p->pGia, iObj )
    //    assert( !Vec_BitEntry(p->vMarksNo, iObj) );
    //Gia_ManForEachLut2( p->pGia, iObj )
    //    assert( !Vec_BitEntry(p->vMarksAnd, iObj) );
    // clean arrays
    Vec_IntClear( p->vNodes );
    Vec_IntClear( p->vAnds );
    // add root node
    Spl_ManLutMffcSize( p->pGia, iPivot, p->vCands, p->vMarksAnd );
    Spl_ManAddNode( p, iPivot, p->vCands );
    if ( Vec_IntSize(p->vAnds) > p->Limit )
        return 0;
    //printf( "%d ", iPivot );
    // add one node at a time
    while ( (iObj = Spl_ManFindOne(p)) )
    {
        assert( Gia_ObjIsLut2(p->pGia, iObj) );
        assert( !Vec_BitEntry(p->vMarksNo, iObj) );
        CountAdd = Spl_ManLutMffcSize( p->pGia, iObj, p->vCands, p->vMarksAnd );
        if ( Vec_IntSize(p->vAnds) + CountAdd > p->Limit )
            break;
        Spl_ManAddNode( p, iObj, p->vCands );
        //printf( "+%d ", iObj );
    }
    //printf( "\n" );
    Vec_IntSort( p->vNodes, 0 );
    Vec_IntSort( p->vAnds, 0 );
    Spl_ManWinFindLeavesRoots( p );
    Vec_IntSort( p->vLeaves, 0 );
    Vec_IntSort( p->vRoots, 0 );
    return 1;
}